

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

bool __thiscall
rapidjson::internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Int64
          (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,int64_t i)

{
  size_t i_1;
  long lVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  uchar *d;
  Number n;
  int64_t local_18;
  double local_10;
  
  local_18 = i;
  local_10 = (double)i;
  uVar3 = 0xaf63bb4c8601b479;
  lVar1 = 0;
  do {
    uVar3 = (uVar3 ^ *(byte *)((long)&local_18 + lVar1)) * 0x100000001b3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  puVar2 = Stack<rapidjson::CrtAllocator>::Push<unsigned_long>(&this->stack_,1);
  *puVar2 = uVar3;
  return true;
}

Assistant:

bool Int64(int64_t i) { Number n; n.u.i = i; n.d = static_cast<double>(i); return WriteNumber(n); }